

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::aggregate_formatter::format
          (aggregate_formatter *this,log_msg *param_1,tm *param_2,memory_buf_t *dest)

{
  pointer __src;
  size_t __n;
  ptrdiff_t _Num;
  ulong uVar1;
  char *buf_ptr;
  
  __src = (this->str_)._M_dataplus._M_p;
  __n = (this->str_)._M_string_length;
  uVar1 = (dest->super_buffer<char>).size_ + __n;
  if ((dest->super_buffer<char>).capacity_ < uVar1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar1);
  }
  if (__n != 0) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,__n);
  }
  (dest->super_buffer<char>).size_ = uVar1;
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override
    {
        fmt_helper::append_string_view(str_, dest);
    }